

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpsClient.cpp
# Opt level: O3

void __thiscall xmrig::HttpsClient::flush(HttpsClient *this)

{
  int iVar1;
  uv_buf_t buf;
  undefined1 local_20 [8];
  long local_18;
  
  local_18 = BIO_ctrl((BIO *)this->m_writeBio,3,0,local_20);
  if (local_18 != 0) {
    iVar1 = uv_is_writable((this->super_HttpClient).super_HttpContext.m_tcp);
    if (iVar1 != 0) {
      iVar1 = uv_try_write((this->super_HttpClient).super_HttpContext.m_tcp,local_20,1);
      if (iVar1 != (int)local_18) {
        HttpContext::close((HttpContext *)this,-5);
      }
    }
    BIO_ctrl((BIO *)this->m_writeBio,1,0,(void *)0x0);
  }
  return;
}

Assistant:

void xmrig::HttpsClient::flush()
{
    uv_buf_t buf;
    buf.len = BIO_get_mem_data(m_writeBio, &buf.base);

    if (buf.len == 0) {
        return;
    }

    bool result = false;
    if (uv_is_writable(stream())) {
        result = uv_try_write(stream(), &buf, 1) == static_cast<int>(buf.len);

        if (!result) {
            close(UV_EIO);
        }
    }

    (void) BIO_reset(m_writeBio);
}